

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O3

void __thiscall
xemmai::t_define<xemmai::t_global>::f_derive<xemmai::t_module,xemmai::t_object>
          (t_define<xemmai::t_global> *this)

{
  t_slot *ptVar1;
  t_object *ptVar2;
  t_global *ptVar3;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_object *ptVar4;
  long in_FS_OFFSET;
  
  ptVar3 = this->v_library;
  ptVar4 = t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<xemmai::t_module>>
                     ((ptVar3->v_type_object).v_p,(t_object *)&ptVar3[-1].v_symbol_greater,
                      &this->v_fields);
  (ptVar3->v_type_module).v_p = (t_type_of<xemmai::t_object> *)ptVar4->v_data;
  if ((t_object *)0x4 < ptVar4) {
    this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
    *this_00->v_head = ptVar4;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  LOCK();
  ptVar1 = &(ptVar3->v_type_module).v_slot;
  ptVar2 = (ptVar1->v_p)._M_b._M_p;
  (ptVar1->v_p)._M_b._M_p = ptVar4;
  UNLOCK();
  if ((t_object *)0x4 < ptVar2) {
    this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
    *this_01->v_head = ptVar2;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
      return;
    }
    this_01->v_head = this_01->v_head + 1;
  }
  return;
}

Assistant:

void f_derive()
	{
		v_library->template f_type_slot<T>().f_construct(v_library->template f_type<T_super>()->template f_derive<t_type_of<T>>(t_object::f_of(v_library), v_fields));
	}